

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTC.cc
# Opt level: O2

void QTC::TC_real(char *scope,char *ccase,int n)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  mapped_type_conflict1 *pmVar4;
  size_type sVar5;
  FILE *__stream;
  string value;
  string filename;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_80;
  string local_58;
  pair<const_char_*,_int> local_38;
  
  if (TC_real(char_const*,char_const*,int)::active_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&TC_real(char_const*,char_const*,int)::active_abi_cxx11_);
    if (iVar2 != 0) {
      TC_real(char_const*,char_const*,int)::active_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
      _M_header._M_color = _S_red;
      TC_real(char_const*,char_const*,int)::active_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
      _M_header._M_parent = (_Base_ptr)0x0;
      TC_real(char_const*,char_const*,int)::active_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
      _M_header._M_left =
           &TC_real(char_const*,char_const*,int)::active_abi_cxx11_._M_t._M_impl.
            super__Rb_tree_header._M_header;
      TC_real(char_const*,char_const*,int)::active_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
      _M_header._M_right =
           &TC_real(char_const*,char_const*,int)::active_abi_cxx11_._M_t._M_impl.
            super__Rb_tree_header._M_header;
      TC_real(char_const*,char_const*,int)::active_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
      _M_node_count = 0;
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                   ::~map,&TC_real(char_const*,char_const*,int)::active_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&TC_real(char_const*,char_const*,int)::active_abi_cxx11_);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,scope,(allocator<char> *)&local_58);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::find(&TC_real(char_const*,char_const*,int)::active_abi_cxx11_._M_t,&local_80.first);
  std::__cxx11::string::~string((string *)&local_80);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &TC_real(char_const*,char_const*,int)::active_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    local_80.first._M_dataplus._M_p = (pointer)&local_80.first.field_2;
    local_80.first._M_string_length = 0;
    local_80.first.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"TC_SCOPE",(allocator<char> *)&local_38);
    bVar1 = QUtil::get_env(&local_58,&local_80.first);
    if (bVar1) {
      bVar1 = std::operator==(&local_80.first,scope);
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,scope,(allocator<char> *)&local_58);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&TC_real(char_const*,char_const*,int)::active_abi_cxx11_,&local_80.first);
    *pmVar4 = bVar1;
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,scope,(allocator<char> *)&local_58);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            ::find(&TC_real(char_const*,char_const*,int)::active_abi_cxx11_._M_t,&local_80.first);
    std::__cxx11::string::~string((string *)&local_80);
  }
  if ((char)iVar3._M_node[2]._M_color == _S_black) {
    if (TC_real(char_const*,char_const*,int)::cache_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&TC_real(char_const*,char_const*,int)::cache_abi_cxx11_);
      if (iVar2 != 0) {
        TC_real(char_const*,char_const*,int)::cache_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
        _M_header._M_color = _S_red;
        TC_real(char_const*,char_const*,int)::cache_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
        _M_header._M_parent = (_Base_ptr)0x0;
        TC_real(char_const*,char_const*,int)::cache_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
        _M_header._M_left =
             &TC_real(char_const*,char_const*,int)::cache_abi_cxx11_._M_t._M_impl.
              super__Rb_tree_header._M_header;
        TC_real(char_const*,char_const*,int)::cache_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
        _M_header._M_right =
             &TC_real(char_const*,char_const*,int)::cache_abi_cxx11_._M_t._M_impl.
              super__Rb_tree_header._M_header;
        TC_real(char_const*,char_const*,int)::cache_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
        _M_node_count = 0;
        __cxa_atexit(std::
                     set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::~set,&TC_real(char_const*,char_const*,int)::cache_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&TC_real(char_const*,char_const*,int)::cache_abi_cxx11_);
      }
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"TC_FILENAME",(allocator<char> *)&local_38);
    bVar1 = QUtil::get_env(&local_80.first,&local_58);
    std::__cxx11::string::~string((string *)&local_80);
    if (bVar1) {
      local_38.first = ccase;
      local_38.second = n;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      pair<const_char_*,_int,_true>(&local_80,&local_38);
      sVar5 = std::
              set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::count(&TC_real(char_const*,char_const*,int)::cache_abi_cxx11_,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      if (sVar5 == 0) {
        local_38.first = ccase;
        local_38.second = n;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
        pair<const_char_*,_int,_true>(&local_80,&local_38);
        std::
        _Rb_tree<std::pair<std::__cxx11::string,int>,std::pair<std::__cxx11::string,int>,std::_Identity<std::pair<std::__cxx11::string,int>>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::__cxx11::string,int>>>
        ::_M_insert_unique<std::pair<std::__cxx11::string,int>>
                  ((_Rb_tree<std::pair<std::__cxx11::string,int>,std::pair<std::__cxx11::string,int>,std::_Identity<std::pair<std::__cxx11::string,int>>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::__cxx11::string,int>>>
                    *)&TC_real(char_const*,char_const*,int)::cache_abi_cxx11_,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        __stream = (FILE *)QUtil::safe_fopen(local_58._M_dataplus._M_p,"ab");
        fprintf(__stream,"%s %d\n",ccase,(ulong)(uint)n);
        fclose(__stream);
      }
    }
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void
QTC::TC_real(char const* const scope, char const* const ccase, int n)
{
    static std::map<std::string, bool> active;
    auto is_active = active.find(scope);
    if (is_active == active.end()) {
        active[scope] = tc_active(scope);
        is_active = active.find(scope);
    }

    if (!is_active->second) {
        return;
    }

    static std::set<std::pair<std::string, int>> cache;

    std::string filename;
#ifdef _WIN32
# define TC_ENV "TC_WIN_FILENAME"
#else
# define TC_ENV "TC_FILENAME"
#endif
    if (!QUtil::get_env(TC_ENV, &filename)) {
        return;
    }
#undef TC_ENV

    if (cache.count(std::make_pair(ccase, n))) {
        return;
    }
    cache.insert(std::make_pair(ccase, n));

    FILE* tc = QUtil::safe_fopen(filename.c_str(), "ab");
    fprintf(tc, "%s %d\n", ccase, n);
    fclose(tc);
}